

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O3

int __thiscall
vkt::memory::anon_unknown_0::RenderVertexStorageImage::verify
          (RenderVertexStorageImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  int iVar1;
  ChannelType y;
  ChannelOrder x;
  long lVar2;
  uint uVar3;
  UVec4 pixel;
  undefined1 local_78 [24];
  int aiStack_60 [2];
  PixelBufferAccess local_58;
  
  lVar2 = *(long *)ctx;
  iVar1 = *(int *)(lVar2 + 0x50) * *(int *)(lVar2 + 0x54) * 2;
  if (0 < iVar1) {
    uVar3 = 0;
    do {
      tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(lVar2 + 0x48));
      lVar2 = (long)local_58.super_ConstPixelBufferAccess.m_size.m_data[0];
      tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(*(long *)ctx + 0x48));
      tcu::ConstPixelBufferAccess::getPixelInt
                ((ConstPixelBufferAccess *)local_78,(int)&local_58,
                 (int)((long)(ulong)(uVar3 >> 1) / lVar2),(int)((long)(ulong)(uVar3 >> 1) % lVar2));
      if ((uVar3 & 1) == 0) {
        tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(ctx + 8));
        x = local_78._0_4_;
        y = local_78._4_4_;
      }
      else {
        tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(ctx + 8));
        x = local_78._8_4_;
        y = local_78._12_4_;
      }
      aiStack_60[0] = 0x3f800000;
      aiStack_60[1] = 0x3f800000;
      local_78._16_4_ = 0x3f800000;
      local_78._20_4_ = 0x3f800000;
      tcu::PixelBufferAccess::setPixel(&local_58,(Vec4 *)(local_78 + 0x10),x,y,0);
      uVar3 = uVar3 + 1;
      lVar2 = *(long *)ctx;
      iVar1 = *(int *)(lVar2 + 0x50) * *(int *)(lVar2 + 0x54) * 2;
    } while ((int)uVar3 < iVar1);
  }
  return iVar1;
}

Assistant:

void RenderVertexStorageImage::verify (VerifyRenderPassContext& context, size_t)
{
	for (int pos = 0; pos < (int)(context.getReferenceImage().getWidth() * context.getReferenceImage().getHeight() * 2); pos++)
	{
		const tcu::IVec3		size	= context.getReferenceImage().getAccess().getSize();
		const tcu::UVec4		pixel	= context.getReferenceImage().getAccess().getPixelUint((pos / 2) / size.x(), (pos / 2) % size.x());

		if (pos % 2 == 0)
			context.getReferenceTarget().getAccess().setPixel(Vec4(1.0f, 1.0f, 1.0f, 1.0f), pixel.x(), pixel.y());
		else
			context.getReferenceTarget().getAccess().setPixel(Vec4(1.0f, 1.0f, 1.0f, 1.0f), pixel.z(), pixel.w());
	}
}